

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O0

void __thiscall phoenix_flm_t::_read(phoenix_flm_t *this)

{
  uint16_t uVar1;
  uint32_t uVar2;
  vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
  *this_00;
  pointer this_01;
  flm_entry_t *this_02;
  unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_> local_48;
  int local_40;
  uint local_3c;
  int i;
  int l_entries;
  string local_30;
  phoenix_flm_t *local_10;
  phoenix_flm_t *this_local;
  
  local_10 = this;
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,10);
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_num_entries = uVar1;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_reserved = uVar2;
  this_00 = (vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
             *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::
  vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
  ::vector(this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>>>
              *)&i,this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ::operator=(&this->m_entries,
              (unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
               *)&i);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
                 *)&i);
  uVar1 = num_entries(this);
  local_3c = (uint)uVar1;
  for (local_40 = 0; local_40 < (int)local_3c; local_40 = local_40 + 1) {
    this_01 = std::
              unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
              ::operator->(&this->m_entries);
    this_02 = (flm_entry_t *)operator_new(0x58);
    flm_entry_t::flm_entry_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>::
    unique_ptr<std::default_delete<phoenix_flm_t::flm_entry_t>,void>
              ((unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>
                *)&local_48,this_02);
    std::
    vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
    ::push_back(this_01,(value_type *)&local_48);
    std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>::
    ~unique_ptr(&local_48);
  }
  return;
}

Assistant:

void phoenix_flm_t::_read() {
    m_signature = m__io->read_bytes(10);
    m_num_entries = m__io->read_u2le();
    m_reserved = m__io->read_u4le();
    m_entries = std::unique_ptr<std::vector<std::unique_ptr<flm_entry_t>>>(new std::vector<std::unique_ptr<flm_entry_t>>());
    const int l_entries = num_entries();
    for (int i = 0; i < l_entries; i++) {
        m_entries->push_back(std::move(std::unique_ptr<flm_entry_t>(new flm_entry_t(m__io, this, m__root))));
    }
}